

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall
btQuantizedBvh::reportBoxCastOverlappingNodex
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *raySource,
          btVector3 *rayTarget,btVector3 *aabbMin,btVector3 *aabbMax)

{
  int in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  
  if (this->m_useQuantization == true) {
    walkStacklessQuantizedTreeAgainstRay
              (this,nodeCallback,raySource,rayTarget,aabbMin,aabbMax,0,this->m_curNodeIndex);
    return;
  }
  walkStacklessTreeAgainstRay
            (this,nodeCallback,raySource,rayTarget,aabbMin,aabbMax,in_stack_ffffffffffffffe8,
             in_stack_fffffffffffffff0);
  return;
}

Assistant:

void	btQuantizedBvh::reportBoxCastOverlappingNodex(btNodeOverlapCallback* nodeCallback, const btVector3& raySource, const btVector3& rayTarget, const btVector3& aabbMin,const btVector3& aabbMax) const
{
	//always use stackless

	if (m_useQuantization)
	{
		walkStacklessQuantizedTreeAgainstRay(nodeCallback, raySource, rayTarget, aabbMin, aabbMax, 0, m_curNodeIndex);
	}
	else
	{
		walkStacklessTreeAgainstRay(nodeCallback, raySource, rayTarget, aabbMin, aabbMax, 0, m_curNodeIndex);
	}
	/*
	{
		//recursive traversal
		btVector3 qaabbMin = raySource;
		btVector3 qaabbMax = raySource;
		qaabbMin.setMin(rayTarget);
		qaabbMax.setMax(rayTarget);
		qaabbMin += aabbMin;
		qaabbMax += aabbMax;
		reportAabbOverlappingNodex(nodeCallback,qaabbMin,qaabbMax);
	}
	*/

}